

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_group.hpp
# Opt level: O2

void __thiscall
oqpi::
parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)0,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
::activeWait(parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)0,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
             *this)

{
  pointer ptVar1;
  bool bVar2;
  void *in_RSI;
  task_handle *hTask;
  pointer this_00;
  
  ptVar1 = (this->tasks_).super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->tasks_).
                 super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != ptVar1; this_00 = this_00 + 1) {
    bVar2 = task_handle::tryGrab(this_00);
    if (bVar2) {
      task_handle::execute(this_00);
    }
  }
  notifier<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>_>
  ::wait((notifier<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>_>
          *)this,in_RSI);
  return;
}

Assistant:

virtual void activeWait() override final
        {
            for (auto &hTask : tasks_)
            {
                if (hTask.tryGrab())
                {
                    hTask.execute();
                }
            }

            this->wait();
        }